

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_attr.c
# Opt level: O1

exr_result_t
exr_attr_declare_by_type
          (exr_context_t ctxt,int part_index,char *name,char *type,exr_attribute_t **outattr)

{
  exr_result_t eVar1;
  _internal_exr_context *pctxt;
  
  if (ctxt == (exr_context_t)0x0) {
    return 2;
  }
  if ((-1 < part_index) && (part_index < *(int *)(ctxt + 0xc4))) {
    if (*ctxt == (_priv_exr_context_t)0x1) {
      eVar1 = exr_attr_list_add_by_type
                        (ctxt,(exr_attribute_list_t *)
                              (*(long *)(*(long *)(ctxt + 0x1d8) + (ulong)(uint)part_index * 8) + 8)
                         ,name,type,0,(uint8_t **)0x0,outattr);
      return eVar1;
    }
    eVar1 = (**(code **)(ctxt + 0x38))(ctxt,8);
    return eVar1;
  }
  eVar1 = (**(code **)(ctxt + 0x48))
                    (ctxt,4,"Part index (%d) out of range",(ulong)(uint)part_index,
                     *(code **)(ctxt + 0x48));
  return eVar1;
}

Assistant:

exr_result_t
exr_attr_declare_by_type (
    exr_context_t     ctxt,
    int               part_index,
    const char*       name,
    const char*       type,
    exr_attribute_t** outattr)
{
    exr_result_t rv;
    EXR_PROMOTE_LOCKED_CONTEXT_AND_PART_OR_ERROR (ctxt, part_index);

    if (pctxt->mode != EXR_CONTEXT_WRITE)
        return EXR_UNLOCK_AND_RETURN_PCTXT (
            pctxt->standard_error (pctxt, EXR_ERR_NOT_OPEN_WRITE));

    rv = exr_attr_list_add_by_type (
        ctxt, &(part->attributes), name, type, 0, NULL, outattr);
    return EXR_UNLOCK_AND_RETURN_PCTXT (rv);
}